

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_map_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::MapFieldGenerator::GenerateByteSize
          (MapFieldGenerator *this,Printer *printer)

{
  undefined1 local_50 [8];
  Formatter format;
  Printer *printer_local;
  MapFieldGenerator *this_local;
  
  format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)printer;
  Formatter::Formatter((Formatter *)local_50,printer,&(this->super_FieldGenerator).variables_);
  Formatter::operator()<>
            ((Formatter *)local_50,
             "total_size += $tag_size$ *\n    ::$proto_ns$::internal::FromIntSize(this->_internal_$name$_size());\nfor (::$proto_ns$::Map< $key_cpp$, $val_cpp$ >::const_iterator\n    it = this->_internal_$name$().begin();\n    it != this->_internal_$name$().end(); ++it) {\n  total_size += $map_classname$::Funcs::ByteSizeLong(it->first, it->second);\n}\n"
            );
  Formatter::~Formatter((Formatter *)local_50);
  return;
}

Assistant:

void MapFieldGenerator::GenerateByteSize(io::Printer* printer) const {
  Formatter format(printer, variables_);
  format(
      "total_size += $tag_size$ *\n"
      "    "
      "::$proto_ns$::internal::FromIntSize(this->_internal_$name$_size());\n"
      "for (::$proto_ns$::Map< $key_cpp$, $val_cpp$ >::const_iterator\n"
      "    it = this->_internal_$name$().begin();\n"
      "    it != this->_internal_$name$().end(); ++it) {\n"
      "  total_size += $map_classname$::Funcs::ByteSizeLong(it->first, "
      "it->second);\n"
      "}\n");
}